

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O0

Error asmjit::X86Logging::formatOperand
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                Operand_ *op)

{
  ulong uVar1;
  Error EVar2;
  uint uVar3;
  undefined4 in_ECX;
  uint in_ESI;
  StringBuilder *in_RDI;
  CodeEmitter *in_R8;
  int64_t val;
  Imm *i;
  Error _err_13;
  Error _err_12;
  Error _err_11;
  char prefix;
  uint32_t base;
  uint64_t off;
  Error _err_10;
  Error _err_9;
  Error _err_8;
  Error _err_7;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  uint32_t seg;
  Error _err;
  X86Mem *m;
  char cVar4;
  undefined8 in_stack_fffffffffffffbf0;
  uint32_t op_00;
  StringBuilder *in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc04;
  char *in_stack_fffffffffffffc08;
  StringBuilder *str;
  uint32_t in_stack_fffffffffffffc14;
  StringBuilder *in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  uint32_t in_stack_fffffffffffffc34;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  ulong local_3c0;
  uint32_t in_stack_fffffffffffffc74;
  CodeEmitter *in_stack_fffffffffffffc78;
  CodeEmitter *pCVar5;
  uint32_t uVar6;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 uVar7;
  Error local_354;
  CodeEmitter *pCVar8;
  uint32_t uVar9;
  size_t in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffcc0;
  uint32_t base_00;
  uint64_t in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  uint32_t op_01;
  StringBuilder *in_stack_fffffffffffffcd8;
  
  op_01 = (uint32_t)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  base_00 = (uint32_t)((ulong)in_stack_fffffffffffffcc0 >> 0x20);
  if (((ulong)in_R8->_vptr_CodeEmitter & 7) == 1) {
    local_354 = formatRegister((StringBuilder *)
                               CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                               in_stack_fffffffffffffc34,
                               (CodeEmitter *)
                               CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                               (uint32_t)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                               (uint32_t)in_stack_fffffffffffffc20,
                               (uint32_t)((ulong)in_stack_fffffffffffffc18 >> 0x20));
  }
  else if (((ulong)in_R8->_vptr_CodeEmitter & 7) == 2) {
    str = in_RDI;
    pCVar5 = in_R8;
    pCVar8 = in_R8;
    x86GetAddressSizeString(*(uint *)&in_R8->_vptr_CodeEmitter >> 0x18);
    uVar9 = (uint32_t)((ulong)pCVar8 >> 0x20);
    uVar6 = (uint32_t)((ulong)pCVar5 >> 0x20);
    EVar2 = StringBuilder::_opString
                      (in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,(char *)str,
                       CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    local_354 = EVar2;
    if ((EVar2 == 0) &&
       (((uVar3 = *(uint *)&in_R8->_vptr_CodeEmitter >> 0x15 & 7, uVar3 == 0 || (6 < uVar3)) ||
        (local_354 = StringBuilder::appendFormat(in_RDI,"%s:",(ulong)(uVar3 << 2) + 0x236270),
        local_354 == 0)))) {
      op_00 = (uint32_t)((ulong)in_stack_fffffffffffffbf0 >> 0x20);
      cVar4 = (char)((ulong)in_stack_fffffffffffffbf0 >> 0x18);
      local_354 = StringBuilder::_opChar(in_stack_fffffffffffffbf8,op_00,cVar4);
      if ((local_354 == 0) &&
         (((*(uint *)&in_R8->_vptr_CodeEmitter >> 0xd & 3) != 1 ||
          (local_354 = StringBuilder::_opString
                                 (in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,(char *)str,
                                  CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00)),
          local_354 == 0)))) {
        if (((ulong)in_R8->_vptr_CodeEmitter & 0xf8) != 0) {
          if (((ulong)in_R8->_vptr_CodeEmitter & 0xf8) == 8) {
            EVar2 = Logging::formatLabel
                              ((StringBuilder *)CONCAT44(in_ECX,in_stack_fffffffffffffc88),uVar6,
                               in_R8,EVar2);
          }
          else {
            if ((((ulong)in_R8->_vptr_CodeEmitter & 0x8000) != 0) &&
               (EVar2 = StringBuilder::_opString
                                  (in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,(char *)str,
                                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00)),
               EVar2 != 0)) {
              return EVar2;
            }
            if ((((ulong)in_R8->_vptr_CodeEmitter & 0x10000) != 0) &&
               (EVar2 = StringBuilder::_opString
                                  (in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,(char *)str,
                                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00)),
               EVar2 != 0)) {
              return EVar2;
            }
            uVar7 = in_ECX;
            EVar2 = formatRegister((StringBuilder *)
                                   CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                                   in_stack_fffffffffffffc34,
                                   (CodeEmitter *)
                                   CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28),
                                   (uint32_t)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                                   (uint32_t)in_stack_fffffffffffffc20,
                                   (uint32_t)((ulong)in_stack_fffffffffffffc18 >> 0x20));
            in_stack_fffffffffffffc04 = in_ECX;
            in_ECX = uVar7;
          }
          if (EVar2 != 0) {
            return EVar2;
          }
        }
        if ((((ulong)in_R8->_vptr_CodeEmitter & 0x1f00) == 0) ||
           (((in_stack_fffffffffffffc00 = in_ECX,
             local_354 = StringBuilder::_opChar(in_stack_fffffffffffffbf8,op_00,cVar4),
             local_354 == 0 &&
             (local_354 = formatRegister((StringBuilder *)
                                         CONCAT44(in_stack_fffffffffffffc3c,
                                                  in_stack_fffffffffffffc38),
                                         in_stack_fffffffffffffc34,
                                         (CodeEmitter *)
                                         CONCAT44(in_stack_fffffffffffffc2c,
                                                  in_stack_fffffffffffffc28),
                                         (uint32_t)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                                         (uint32_t)in_stack_fffffffffffffc20,
                                         (uint32_t)((ulong)in_stack_fffffffffffffc18 >> 0x20)),
             local_354 == 0)) &&
            ((((ulong)in_R8->_vptr_CodeEmitter & 0x180000) == 0 ||
             (local_354 = StringBuilder::appendFormat
                                    (in_RDI,"*%u",
                                     (ulong)(uint)(1 << ((byte)(*(uint *)&in_R8->_vptr_CodeEmitter
                                                               >> 0x13) & 3))), local_354 == 0))))))
        {
          if ((*(uint *)&in_R8->_vptr_CodeEmitter >> 3 & 0x1f) == 0) {
            local_3c0._0_4_ = (in_R8->_codeInfo)._archInfo;
            local_3c0._4_4_ = (in_R8->_codeInfo).field_1;
          }
          else {
            local_3c0 = (ulong)(int)(in_R8->_codeInfo)._archInfo.field_0._signature;
          }
          cVar4 = (char)(local_3c0 >> 0x18);
          uVar6 = (uint32_t)(local_3c0 >> 0x20);
          if (local_3c0 != 0) {
            if ((long)local_3c0 < 0) {
              local_3c0 = (local_3c0 ^ 0xffffffffffffffff) + 1;
            }
            EVar2 = StringBuilder::_opChar((StringBuilder *)in_R8,uVar6,cVar4);
            if (EVar2 != 0) {
              return EVar2;
            }
            if ((((in_ESI & 8) != 0) && (9 < local_3c0)) &&
               (EVar2 = StringBuilder::_opString
                                  (in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,(char *)str,
                                   CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00)),
               EVar2 != 0)) {
              return EVar2;
            }
            EVar2 = StringBuilder::_opNumber
                              (in_stack_fffffffffffffcd8,op_01,in_stack_fffffffffffffcc8,base_00,
                               in_stack_fffffffffffffcb8,uVar9);
            if (EVar2 != 0) {
              return EVar2;
            }
          }
          local_354 = StringBuilder::_opChar((StringBuilder *)in_R8,uVar6,cVar4);
        }
      }
    }
  }
  else {
    uVar9 = (uint32_t)((ulong)in_R8 >> 0x20);
    if (((ulong)in_R8->_vptr_CodeEmitter & 7) == 3) {
      uVar1._0_4_ = (in_R8->_codeInfo)._archInfo;
      uVar1._4_4_ = (in_R8->_codeInfo).field_1;
      if (((in_ESI & 4) == 0) || (uVar1 < 10)) {
        local_354 = StringBuilder::_opNumber
                              (in_stack_fffffffffffffcd8,op_01,in_stack_fffffffffffffcc8,base_00,
                               in_stack_fffffffffffffcb8,uVar9);
      }
      else {
        local_354 = StringBuilder::_opNumber
                              (in_stack_fffffffffffffcd8,op_01,in_stack_fffffffffffffcc8,base_00,
                               in_stack_fffffffffffffcb8,uVar9);
      }
    }
    else if (((ulong)in_R8->_vptr_CodeEmitter & 7) == 4) {
      local_354 = Logging::formatLabel
                            ((StringBuilder *)CONCAT44(in_ECX,in_stack_fffffffffffffc88),uVar9,
                             in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
    }
    else {
      local_354 = StringBuilder::_opString
                            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,
                             in_stack_fffffffffffffc08,
                             CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    }
  }
  return local_354;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Logging::formatOperand(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  const Operand_& op) noexcept {

  if (op.isReg())
    return formatRegister(sb, logOptions, emitter, archType, op.as<Reg>().getType(), op.as<Reg>().getId());

  if (op.isMem()) {
    const X86Mem& m = op.as<X86Mem>();
    ASMJIT_PROPAGATE(sb.appendString(x86GetAddressSizeString(m.getSize())));

    // Segment override prefix.
    uint32_t seg = m.getSegmentId();
    if (seg != X86Seg::kIdNone && seg < X86Seg::kIdCount)
      ASMJIT_PROPAGATE(sb.appendFormat("%s:", x86RegFormatStrings + 224 + seg * 4));

    ASMJIT_PROPAGATE(sb.appendChar('['));
    if (m.isAbs())
      ASMJIT_PROPAGATE(sb.appendString("abs "));

    if (m.hasBase()) {
      if (m.hasBaseLabel()) {
        ASMJIT_PROPAGATE(Logging::formatLabel(sb, logOptions, emitter, m.getBaseId()));
      }
      else {
        if (m.isArgHome()) ASMJIT_PROPAGATE(sb.appendString("$"));
        if (m.isRegHome()) ASMJIT_PROPAGATE(sb.appendString("&"));
        ASMJIT_PROPAGATE(formatRegister(sb, logOptions, emitter, archType, m.getBaseType(), m.getBaseId()));
      }
    }

    if (m.hasIndex()) {
      ASMJIT_PROPAGATE(sb.appendChar('+'));
      ASMJIT_PROPAGATE(formatRegister(sb, logOptions, emitter, archType, m.getIndexType(), m.getIndexId()));
      if (m.hasShift())
        ASMJIT_PROPAGATE(sb.appendFormat("*%u", 1 << m.getShift()));
    }

    uint64_t off = static_cast<uint64_t>(m.getOffset());
    if (off) {
      uint32_t base = 10;
      char prefix = '+';

      if (static_cast<int64_t>(off) < 0) {
        off = ~off + 1;
        prefix = '-';
      }

      ASMJIT_PROPAGATE(sb.appendChar(prefix));
      if ((logOptions & Logger::kOptionHexDisplacement) != 0 && off > 9) {
        ASMJIT_PROPAGATE(sb.appendString("0x", 2));
        base = 16;
      }
      ASMJIT_PROPAGATE(sb.appendUInt(off, base));
    }

    return sb.appendChar(']');
  }

  if (op.isImm()) {
    const Imm& i = op.as<Imm>();
    int64_t val = i.getInt64();

    if ((logOptions & Logger::kOptionHexImmediate) != 0 && static_cast<uint64_t>(val) > 9)
      return sb.appendUInt(static_cast<uint64_t>(val), 16);
    else
      return sb.appendInt(val, 10);
  }

  if (op.isLabel()) {
    return Logging::formatLabel(sb, logOptions, emitter, op.getId());
  }

  return sb.appendString("<None>");
}